

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O2

void do_with_oh_void(qpdf_data qpdf,qpdf_oh oh,function<void_(QPDFObjectHandle_&)> *fn)

{
  undefined1 this [8];
  uint uVar1;
  char *cstr;
  Pipeline *this_00;
  undefined1 local_152;
  bool ret;
  qpdf_error_code_e local_150 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_148;
  undefined1 local_140 [8];
  function<bool_(_qpdf_data_*)> local_138;
  _Any_data local_118;
  code *local_108;
  code *pcStack_100;
  int local_ec;
  _Any_data local_e8;
  code *local_d8;
  code *local_d0;
  _Any_data local_c8;
  code *local_b8;
  code *pcStack_b0;
  _Any_data local_a8;
  code *local_98;
  code *pcStack_90;
  _Any_data local_80;
  long local_70;
  undefined8 uStack_68;
  _Any_data local_60;
  long local_50;
  undefined8 uStack_48;
  qpdf_oh local_40;
  function<bool_()> local_38;
  
  local_e8._M_unused._M_object = &local_152;
  local_152 = 0;
  local_e8._8_8_ = 0;
  local_d0 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:865:12)>
             ::_M_invoke;
  local_d8 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:865:12)>
             ::_M_manager;
  std::function<void_(QPDFObjectHandle_&)>::function
            ((function<void_(QPDFObjectHandle_&)> *)&local_80,fn);
  local_108 = (code *)0x0;
  pcStack_100 = (code *)0x0;
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  local_118._M_unused._M_object = operator_new(0x20);
  *(undefined8 *)local_118._M_unused._0_8_ = 0;
  *(undefined8 *)((long)local_118._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_118._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)local_118._M_unused._0_8_ + 0x18) = uStack_68;
  if (local_70 != 0) {
    *(void **)local_118._M_unused._0_8_ = local_80._M_unused._M_object;
    *(undefined8 *)((long)local_118._M_unused._0_8_ + 8) = local_80._8_8_;
    *(long *)((long)local_118._M_unused._0_8_ + 0x10) = local_70;
    local_70 = 0;
    uStack_68 = 0;
  }
  pcStack_100 = std::
                _Function_handler<bool_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:938:55)>
                ::_M_invoke;
  local_108 = std::
              _Function_handler<bool_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:938:55)>
              ::_M_manager;
  std::function<bool_()>::function(&local_38,(function<bool_()> *)&local_e8);
  std::function<bool_(QPDFObjectHandle_&)>::function
            ((function<bool_(QPDFObjectHandle_&)> *)&local_60,
             (function<bool_(QPDFObjectHandle_&)> *)&local_118);
  local_c8._M_unused._M_object = (void *)0x0;
  local_c8._8_8_ = 0;
  local_b8 = (code *)0x0;
  pcStack_b0 = (code *)0x0;
  local_40 = oh;
  local_c8._M_unused._M_object = operator_new(0x28);
  *(undefined8 *)local_c8._M_unused._0_8_ = 0;
  *(undefined8 *)((long)local_c8._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_c8._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)local_c8._M_unused._0_8_ + 0x18) = uStack_48;
  if (local_50 != 0) {
    *(void **)local_c8._M_unused._0_8_ = local_60._M_unused._M_object;
    *(undefined8 *)((long)local_c8._M_unused._0_8_ + 8) = local_60._8_8_;
    *(long *)((long)local_c8._M_unused._0_8_ + 0x10) = local_50;
    local_50 = 0;
    uStack_48 = 0;
  }
  *(qpdf_oh *)((long)local_c8._M_unused._0_8_ + 0x20) = oh;
  pcStack_b0 = std::
               _Function_handler<bool_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:919:48)>
               ::_M_invoke;
  local_b8 = std::
             _Function_handler<bool_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:919:48)>
             ::_M_manager;
  local_140 = (undefined1  [8])&ret;
  std::function<bool_(_qpdf_data_*)>::function
            (&local_138,(function<bool_(_qpdf_data_*)> *)&local_c8);
  local_98 = (code *)0x0;
  pcStack_90 = (code *)0x0;
  local_a8._M_unused._M_object = (void *)0x0;
  local_a8._8_8_ = 0;
  local_a8._M_unused._M_object = operator_new(0x28);
  *(undefined1 (*) [8])local_a8._M_unused._0_8_ = local_140;
  *(long *)((long)local_a8._M_unused._0_8_ + 8) = 0;
  *(long *)((long)local_a8._M_unused._0_8_ + 0x10) = 0;
  *(long *)((long)local_a8._M_unused._0_8_ + 0x18) = 0;
  *(_Invoker_type *)((long)local_a8._M_unused._0_8_ + 0x20) = local_138._M_invoker;
  if (local_138.super__Function_base._M_manager != (_Manager_type)0x0) {
    *(void **)((long)local_a8._M_unused._0_8_ + 8) =
         local_138.super__Function_base._M_functor._M_unused._M_object;
    *(undefined8 *)((long)local_a8._M_unused._0_8_ + 0x10) =
         local_138.super__Function_base._M_functor._8_8_;
    *(_Manager_type *)((long)local_a8._M_unused._0_8_ + 0x18) =
         local_138.super__Function_base._M_manager;
    local_138.super__Function_base._M_manager = (_Manager_type)0x0;
    local_138._M_invoker = (_Invoker_type)0x0;
  }
  pcStack_90 = std::
               _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:811:48)>
               ::_M_invoke;
  local_98 = std::
             _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:811:48)>
             ::_M_manager;
  uVar1 = trap_errors(qpdf,(function<void_(_qpdf_data_*)> *)&local_a8);
  std::_Function_base::~_Function_base((_Function_base *)&local_a8);
  std::_Function_base::~_Function_base(&local_138.super__Function_base);
  if (1 < uVar1) {
    if (qpdf->silence_errors == false) {
      if (qpdf->oh_error_occurred == false) {
        local_150[0] = qpdf_e_internal;
        QPDF::getFilename_abi_cxx11_
                  ((string *)local_140,
                   (qpdf->qpdf).super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        local_ec = 0;
        std::__cxx11::list<QPDFExc,std::allocator<QPDFExc>>::
        emplace_back<qpdf_error_code_e,std::__cxx11::string,char_const(&)[1],int,char_const(&)[129]>
                  ((list<QPDFExc,std::allocator<QPDFExc>> *)&qpdf->warnings,local_150,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                   (char (*) [1])0x229c16,&local_ec,
                   (char (*) [129])
                   "C API function caught an exception that it isn\'t returning; please point the application developer to ERROR HANDLING in qpdf-c.h"
                  );
        std::__cxx11::string::~string((string *)local_140);
        qpdf->oh_error_occurred = true;
      }
      QPDFLogger::defaultLogger();
      QPDFLogger::getError((QPDFLogger *)local_140,SUB41(local_150[0],0));
      this = local_140;
      cstr = (char *)(**(code **)(*(long *)(qpdf->error).
                                           super___shared_ptr<QPDFExc,_(__gnu_cxx::_Lock_policy)2>.
                                           _M_ptr + 0x10))();
      this_00 = Pipeline::operator<<((Pipeline *)this,cstr);
      Pipeline::operator<<(this_00,"\n");
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_138);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_148);
    }
    std::function<bool_()>::operator()(&local_38);
  }
  std::_Function_base::~_Function_base((_Function_base *)&local_c8);
  std::_Function_base::~_Function_base((_Function_base *)&local_60);
  std::_Function_base::~_Function_base(&local_38.super__Function_base);
  std::_Function_base::~_Function_base((_Function_base *)&local_118);
  std::_Function_base::~_Function_base((_Function_base *)&local_80);
  std::_Function_base::~_Function_base((_Function_base *)&local_e8);
  return;
}

Assistant:

static void
do_with_oh_void(qpdf_data qpdf, qpdf_oh oh, std::function<void(QPDFObjectHandle&)> fn)
{
    do_with_oh<bool>(qpdf, oh, return_T<bool>(false), [fn](QPDFObjectHandle& o) {
        fn(o);
        return true; // unused
    });
}